

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPile.cpp
# Opt level: O3

void __thiscall
solitaire::piles::StockPile::Snapshot::Snapshot
          (Snapshot *this,shared_ptr<solitaire::piles::StockPile> *stockPile,Cards *pileCards,
          optional<unsigned_int> selectedCardIndex)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pCVar3;
  
  (this->super_Snapshot)._vptr_Snapshot = (_func_int **)&PTR__Snapshot_0032d9f0;
  (this->stockPile).super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (stockPile->super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var2 = (stockPile->super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (stockPile->super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->stockPile).super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar1;
  (this->stockPile).super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (stockPile->super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  pCVar3 = (pileCards->
           super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  (this->pileCards).
  super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pileCards->
       super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->pileCards).
  super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
  super__Vector_impl_data._M_finish = pCVar3;
  (this->pileCards).
  super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pileCards->
       super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (pileCards->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pileCards->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pileCards->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->selectedCardIndex).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_payload_base<unsigned_int>)
       selectedCardIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>;
  return;
}

Assistant:

StockPile::Snapshot::Snapshot(
    std::shared_ptr<StockPile> stockPile, Cards pileCards,
    std::optional<unsigned> selectedCardIndex):
    stockPile {std::move(stockPile)},
    pileCards {std::move(pileCards)},
    selectedCardIndex {std::move(selectedCardIndex)} {
}